

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Mapping.c
# Opt level: O0

char * AArch64_insn_name(csh handle,uint id)

{
  uint local_20;
  uint i;
  uint id_local;
  csh handle_local;
  
  if (id < 0x1c4) {
    if (id < 0x1a1) {
      handle_local = (csh)insn_name_maps[id].name;
    }
    else {
      for (local_20 = 0; local_20 < 0x2b; local_20 = local_20 + 1) {
        if (alias_insn_name_maps[local_20].id == id) {
          return alias_insn_name_maps[local_20].name;
        }
      }
      handle_local = 0;
    }
  }
  else {
    handle_local = 0;
  }
  return (char *)handle_local;
}

Assistant:

const char *AArch64_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	unsigned int i;

	if (id >= ARM64_INS_ENDING)
		return NULL;

	if (id < ARR_SIZE(insn_name_maps))
		return insn_name_maps[id].name;

	// then find alias insn
	for (i = 0; i < ARR_SIZE(alias_insn_name_maps); i++) {
		if (alias_insn_name_maps[i].id == id)
			return alias_insn_name_maps[i].name;
	}

	// not found
	return NULL;
#else
	return NULL;
#endif
}